

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

BOOL Js::CustomExternalWrapperObject::DefineOwnPropertyDescriptor
               (RecyclableObject *obj,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *requestContext)

{
  code *pcVar1;
  anon_class_56_7_0a7f78a2 implicitCall;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  ThreadContext *pTVar5;
  CustomExternalWrapperObject *this;
  CustomExternalWrapperType *this_00;
  JsGetterSetterInterceptor *pJVar6;
  void **ppvVar7;
  undefined4 *puVar8;
  ScriptContext *scriptContext;
  Var pvVar9;
  PropertyDescriptor *local_1a8;
  byte local_191;
  PropertyDescriptor *local_190;
  BOOL settingConfigFalse;
  BOOL isExtensible;
  BOOL hasProperty;
  PropertyDescriptor targetDescriptor;
  BOOL defineResult;
  Var definePropertyResult;
  Var propertyName;
  Var propertyNameNumericValue;
  Var isPropertyNameNumeric;
  Var descVar;
  undefined1 local_c0 [3];
  bool isExtensible_1;
  BOOL isCurrentDescriptorDefined;
  PropertyDescriptor currentDescriptor;
  PropertyDescriptor desc;
  JavascriptFunction *defineOwnPropertyMethod;
  CustomExternalWrapperType *type;
  RecyclableObject *targetObj;
  CustomExternalWrapperObject *customObject;
  ThreadContext *threadContext;
  ScriptContext *requestContext_local;
  bool throwOnError_local;
  PropertyDescriptor *descriptor_local;
  PropertyId propId_local;
  RecyclableObject *obj_local;
  
  pTVar5 = ScriptContext::GetThreadContext(requestContext);
  ThreadContext::ProbeStack(pTVar5,0xc00,requestContext,(PVOID)0x0);
  pTVar5 = ScriptContext::GetThreadContext(requestContext);
  this = VarTo<Js::CustomExternalWrapperObject,Js::RecyclableObject>(obj);
  BVar3 = EnsureInitialized(this,requestContext);
  if (BVar3 == 0) {
    obj_local._4_4_ = 0;
  }
  else {
    this_00 = GetExternalType(this);
    desc.Configurable = false;
    desc.fromProxy = false;
    desc._42_6_ = 0;
    pJVar6 = CustomExternalWrapperType::GetJsGetterSetterInterceptor(this_00);
    ppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&pJVar6->definePropertyTrap);
    if (*ppvVar7 != (void *)0x0) {
      pJVar6 = CustomExternalWrapperType::GetJsGetterSetterInterceptor(this_00);
      ppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&pJVar6->definePropertyTrap);
      desc._40_8_ = VarTo<Js::JavascriptFunction>(*ppvVar7);
    }
    bVar2 = ScriptContext::IsHeapEnumInProgress(requestContext);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                  ,0x20f,"(!requestContext->IsHeapEnumInProgress())",
                                  "!requestContext->IsHeapEnumInProgress()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (desc._40_8_ == 0) {
      PropertyDescriptor::PropertyDescriptor
                ((PropertyDescriptor *)&currentDescriptor.Configurable,descriptor);
      bVar2 = PropertyDescriptor::ValueSpecified
                        ((PropertyDescriptor *)&currentDescriptor.Configurable);
      if (bVar2) {
        scriptContext = RecyclableObject::GetScriptContext(obj);
        pvVar9 = PropertyDescriptor::GetValue(descriptor);
        pvVar9 = CrossSite::MarshalVar(scriptContext,pvVar9,false);
        PropertyDescriptor::SetValue((PropertyDescriptor *)&currentDescriptor.Configurable,pvVar9);
      }
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_c0);
      descVar._4_4_ =
           Js::JavascriptOperators::GetOwnPropertyDescriptor
                     (obj,propId,requestContext,(PropertyDescriptor *)local_c0);
      iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x33])();
      descVar._3_1_ = iVar4 != 0;
      if (descVar._4_4_ == 0) {
        local_190 = (PropertyDescriptor *)0x0;
      }
      else {
        local_190 = (PropertyDescriptor *)local_c0;
      }
      obj_local._4_4_ =
           Js::JavascriptOperators::ValidateAndApplyPropertyDescriptor<true>
                     (obj,propId,(PropertyDescriptor *)&currentDescriptor.Configurable,local_190,
                      (bool)descVar._3_1_,throwOnError,requestContext);
    }
    else {
      isPropertyNameNumeric = PropertyDescriptor::GetOriginal(descriptor);
      if (isPropertyNameNumeric == (Var)0x0) {
        isPropertyNameNumeric =
             Js::JavascriptOperators::FromPropertyDescriptor(descriptor,requestContext);
      }
      pvVar9 = GetName(this,requestContext,propId,&propertyNameNumericValue,&propertyName);
      implicitCall.defineOwnPropertyMethod = (JavascriptFunction *)desc._40_8_;
      implicitCall.threadContext = pTVar5;
      implicitCall.targetObj = obj;
      implicitCall.propertyName = pvVar9;
      implicitCall.isPropertyNameNumeric = propertyNameNumericValue;
      implicitCall.propertyNameNumericValue = propertyName;
      implicitCall.descVar = isPropertyNameNumeric;
      pvVar9 = ThreadContext::
               ExecuteImplicitCall<Js::CustomExternalWrapperObject::DefineOwnPropertyDescriptor(Js::RecyclableObject*,int,Js::PropertyDescriptor_const&,bool,Js::ScriptContext*)::__0>
                         (pTVar5,(RecyclableObject *)desc._40_8_,ImplicitCall_Accessor,implicitCall)
      ;
      targetDescriptor._44_4_ = JavascriptConversion::ToBoolean(pvVar9,requestContext);
      obj_local._4_4_ = targetDescriptor._44_4_;
      if (targetDescriptor._44_4_ == 0) {
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&isExtensible);
        obj_local._4_4_ =
             Js::JavascriptOperators::GetOwnPropertyDescriptor
                       (obj,propId,requestContext,(PropertyDescriptor *)&isExtensible);
        iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x33])();
        bVar2 = PropertyDescriptor::ConfigurableSpecified(descriptor);
        local_191 = 0;
        if (bVar2) {
          bVar2 = PropertyDescriptor::IsConfigurable(descriptor);
          local_191 = bVar2 ^ 0xff;
        }
        if (obj_local._4_4_ == 0) {
          if ((iVar4 == 0) || ((local_191 & 1) != 0)) {
            JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"defineProperty");
          }
        }
        else {
          if (obj_local._4_4_ == 0) {
            local_1a8 = (PropertyDescriptor *)0x0;
          }
          else {
            local_1a8 = (PropertyDescriptor *)&isExtensible;
          }
          BVar3 = Js::JavascriptOperators::IsCompatiblePropertyDescriptor
                            (descriptor,local_1a8,iVar4 != 0,true,requestContext);
          if (BVar3 == 0) {
            JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"defineProperty");
          }
          if (((local_191 & 1) != 0) &&
             (bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)&isExtensible), bVar2
             )) {
            JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"defineProperty");
          }
        }
      }
    }
  }
  return obj_local._4_4_;
}

Assistant:

BOOL CustomExternalWrapperObject::DefineOwnPropertyDescriptor(Js::RecyclableObject * obj, Js::PropertyId propId, const Js::PropertyDescriptor& descriptor, bool throwOnError, Js::ScriptContext * requestContext)
{
    PROBE_STACK(requestContext, Js::Constants::MinStackDefault);

    ThreadContext* threadContext = requestContext->GetThreadContext();

    CustomExternalWrapperObject * customObject = VarTo<CustomExternalWrapperObject>(obj);

    if (!customObject->EnsureInitialized(requestContext))
    {
        return FALSE;
    }

    Js::RecyclableObject * targetObj = obj;

    CustomExternalWrapperType * type = customObject->GetExternalType();
    Js::JavascriptFunction* defineOwnPropertyMethod = nullptr;
    if (type->GetJsGetterSetterInterceptor()->definePropertyTrap != nullptr)
    {
        defineOwnPropertyMethod = Js::VarTo<JavascriptFunction>(type->GetJsGetterSetterInterceptor()->definePropertyTrap);
    }

    Assert(!requestContext->IsHeapEnumInProgress());
    if (nullptr == defineOwnPropertyMethod)
    {
        Js::PropertyDescriptor desc = descriptor;

        if(desc.ValueSpecified())
        {
            // setting the value could be deferred and now we are on a different context from
            // make sure the value has the same context as the containing object.
            desc.SetValue(Js::CrossSite::MarshalVar(targetObj->GetScriptContext(), descriptor.GetValue()));
        }

        PropertyDescriptor currentDescriptor;
        BOOL isCurrentDescriptorDefined = JavascriptOperators::GetOwnPropertyDescriptor(obj, propId, requestContext, &currentDescriptor);

        bool isExtensible = !!obj->IsExtensible();
        return Js::JavascriptOperators::ValidateAndApplyPropertyDescriptor<true>(obj, propId, desc, isCurrentDescriptorDefined ? &currentDescriptor : nullptr, isExtensible, throwOnError, requestContext);
    }

    Js::Var descVar = descriptor.GetOriginal();
    if (descVar == nullptr)
    {
        descVar = Js::JavascriptOperators::FromPropertyDescriptor(descriptor, requestContext);
    }

    Js::Var isPropertyNameNumeric;
    Js::Var propertyNameNumericValue;
    Js::Var propertyName = customObject->GetName(requestContext, propId, &isPropertyNameNumeric, &propertyNameNumericValue);

    Js::Var definePropertyResult = threadContext->ExecuteImplicitCall(defineOwnPropertyMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, defineOwnPropertyMethod, Js::CallInfo(Js::CallFlags_Value, 5), targetObj, propertyName, isPropertyNameNumeric, propertyNameNumericValue, descVar);
    });

    BOOL defineResult = Js::JavascriptConversion::ToBoolean(definePropertyResult, requestContext);
    if (defineResult)
    {
        return defineResult;
    }

    Js::PropertyDescriptor targetDescriptor;
    BOOL hasProperty = Js::JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propId, requestContext, &targetDescriptor);
    BOOL isExtensible = targetObj->IsExtensible();
    BOOL settingConfigFalse = (descriptor.ConfigurableSpecified() && !descriptor.IsConfigurable());
    if (!hasProperty)
    {
        if (!isExtensible || settingConfigFalse)
        {
            Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
        }
    }
    else
    {
        if (!Js::JavascriptOperators::IsCompatiblePropertyDescriptor(descriptor, hasProperty ? &targetDescriptor : nullptr, !!isExtensible, true, requestContext))
        {
            Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
        }
        if (settingConfigFalse && targetDescriptor.IsConfigurable())
        {
            Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
        }
    }
    return hasProperty;
}